

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.h
# Opt level: O0

void TTD::NSLogEvents::CreateError_Execute<(TTD::NSLogEvents::EventKind)27>
               (EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  JsRTSingleVarArgumentAction *executeContext_00;
  JsRTVarsArgumentAction_InternalUse<1UL> *errorData;
  ScriptContext *ctx;
  Var local_28;
  Var res;
  JsRTSingleVarArgumentAction *action;
  ThreadContextTTD *executeContext_local;
  EventLogEntry *evt_local;
  
  action = (JsRTSingleVarArgumentAction *)executeContext;
  executeContext_local = (ThreadContextTTD *)evt;
  errorData = GetInlineEventDataAs<TTD::NSLogEvents::JsRTVarsArgumentAction_InternalUse<1ul>,(TTD::NSLogEvents::EventKind)27>
                        (evt);
  executeContext_00 = action;
  local_28 = (Var)0x0;
  res = errorData;
  ctx = ThreadContextTTD::GetActiveScriptContext((ThreadContextTTD *)action);
  Execute_CreateErrorHelper
            (errorData,(ThreadContextTTD *)executeContext_00,ctx,CreateTypeErrorActionTag,&local_28)
  ;
  if (local_28 != (Var)0x0) {
    JsRTActionHandleResultForReplay<TTD::NSLogEvents::JsRTVarsArgumentAction_InternalUse<1ul>,(TTD::NSLogEvents::EventKind)27>
              ((ThreadContextTTD *)action,(EventLogEntry *)executeContext_local,local_28);
  }
  return;
}

Assistant:

void CreateError_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            const JsRTSingleVarArgumentAction* action = GetInlineEventDataAs<JsRTSingleVarArgumentAction, errorKind>(evt);

            Js::Var res = nullptr;
            Execute_CreateErrorHelper(action, executeContext, executeContext->GetActiveScriptContext(), errorKind, &res);

            if(res != nullptr)
            {
                JsRTActionHandleResultForReplay<JsRTSingleVarArgumentAction, errorKind>(executeContext, evt, res);
            }
        }